

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile-handler.cc
# Opt level: O2

ProfileHandlerToken * __thiscall
ProfileHandler::RegisterCallback
          (ProfileHandler *this,ProfileHandlerCallback callback,void *callback_arg)

{
  unsigned_long *this_00;
  size_t sVar1;
  int in_ECX;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_ffffffffffffff28;
  undefined1 local_d0 [8];
  ScopedSignalBlocker block;
  CallbackList copy;
  ProfileHandlerToken *token;
  SpinLockHolder sl;
  SpinLockHolder cl;
  
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node._M_size = (size_t)operator_new(0x10);
  *(ProfileHandlerCallback *)
   copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
   _M_node._M_size = callback;
  *(void **)(copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
             _M_impl._M_node._M_size + 8) = callback_arg;
  block.sig_set_.__val[0xf] = (unsigned_long)(block.sig_set_.__val + 0xf);
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)block.sig_set_.__val[0xf];
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::push_back
            ((list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)
             block.sig_set_.__val[0xf],
             (value_type *)
             &copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
              _M_impl._M_node._M_size);
  sl.lock_ = &this->control_lock_;
  SpinLock::Lock(sl.lock_);
  ScopedSignalBlocker::ScopedSignalBlocker((ScopedSignalBlocker *)local_d0,this->signal_number_);
  token = (ProfileHandlerToken *)&this->signal_lock_;
  SpinLock::Lock((SpinLock *)token);
  this_00 = block.sig_set_.__val + 0xf;
  std::__cxx11::list<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::splice
            (&this->callbacks_,(int)&this->callbacks_,(__off64_t *)this_00,in_ECX,in_R8,in_R9,
             in_stack_ffffffffffffff28);
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&token);
  ScopedSignalBlocker::~ScopedSignalBlocker((ScopedSignalBlocker *)local_d0);
  this->callback_count_ = this->callback_count_ + 1;
  UpdateTimer(this,true);
  sVar1 = copy.super__List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>.
          _M_impl._M_node._M_size;
  SpinLockHolder::~SpinLockHolder(&sl);
  std::__cxx11::_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_>::_M_clear
            ((_List_base<ProfileHandlerToken_*,_std::allocator<ProfileHandlerToken_*>_> *)this_00);
  return (ProfileHandlerToken *)sVar1;
}

Assistant:

ProfileHandlerToken* ProfileHandler::RegisterCallback(
    ProfileHandlerCallback callback, void* callback_arg) {

  ProfileHandlerToken* token = new ProfileHandlerToken(callback, callback_arg);
  CallbackList copy;
  copy.push_back(token);

  SpinLockHolder cl(&control_lock_);
  {
    ScopedSignalBlocker block(signal_number_);
    SpinLockHolder sl(&signal_lock_);
    callbacks_.splice(callbacks_.end(), copy);
  }

  ++callback_count_;
  UpdateTimer(true);
  return token;
}